

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.cpp
# Opt level: O3

void __thiscall Container::setup_credentials(Container *this)

{
  __gid_t __rgid;
  __uid_t __ruid;
  int iVar1;
  ContextManager *pCVar2;
  string local_38;
  
  __rgid = this->id_;
  iVar1 = setresgid(__rgid,__rgid,__rgid);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Setting process gid to %d failed: %m",(ulong)this->id_);
    (**pCVar2->_vptr_ContextManager)(pCVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = setgroups(0,(__gid_t *)0x0);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Removing process from all groups failed: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  __ruid = this->id_;
  iVar1 = setresuid(__ruid,__ruid,__ruid);
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Setting process uid to %d failed: %m",(ulong)this->id_);
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  iVar1 = setpgrp();
  if (iVar1 != 0) {
    pCVar2 = ContextManager::get();
    format_abi_cxx11_(&local_38,"Setting process group id failed: %m");
    (**pCVar2->_vptr_ContextManager)(pCVar2,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void Container::setup_credentials() {
    if (setresgid(id_, id_, id_) != 0) {
        die(format("Setting process gid to %d failed: %m", id_));
    }
    if (setgroups(0, nullptr) != 0) {
        die(format("Removing process from all groups failed: %m"));
    }
    if (setresuid(id_, id_, id_) != 0) {
        die(format("Setting process uid to %d failed: %m", id_));
    }
    if (setpgrp() != 0) {
        die(format("Setting process group id failed: %m"));
    }
}